

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depfile_parser_test.cc
# Opt level: O3

void __thiscall
DepfileParserTestUnifyMultipleRulesCRLF::Run(DepfileParserTestUnifyMultipleRulesCRLF *this)

{
  pointer pSVar1;
  size_t sVar2;
  char *pcVar3;
  Test *pTVar4;
  bool bVar5;
  int iVar6;
  string err;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  string local_50;
  
  pTVar4 = g_current_test;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  bVar5 = DepfileParserTest::Parse
                    (&this->super_DepfileParserTest,"foo: x\r\nfoo: y\r\nfoo \\\r\nfoo: z\r\n",
                     &local_50);
  testing::Test::Check
            (pTVar4,bVar5,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/depfile_parser_test.cc"
             ,0x109,
             "Parse(\"foo: x\\r\\n\" \"foo: y\\r\\n\" \"foo \\\\\\r\\n\" \"foo: z\\r\\n\", &err)");
  bVar5 = testing::Test::Check
                    (g_current_test,
                     (long)(this->super_DepfileParserTest).parser_.outs_.
                           super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(this->super_DepfileParserTest).parser_.outs_.
                           super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                           super__Vector_impl_data._M_start == 0x10,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/depfile_parser_test.cc"
                     ,0x10a,"1u == parser_.outs_.size()");
  pTVar4 = g_current_test;
  if (bVar5) {
    pSVar1 = (this->super_DepfileParserTest).parser_.outs_.
             super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar2 = pSVar1->len_;
    if (sVar2 == 0) {
      local_70 = &local_60;
      local_68 = 0;
      local_60 = 0;
    }
    else {
      pcVar3 = pSVar1->str_;
      local_70 = &local_60;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,pcVar3,pcVar3 + sVar2);
    }
    iVar6 = std::__cxx11::string::compare((char *)&local_70);
    bVar5 = testing::Test::Check
                      (pTVar4,iVar6 == 0,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/depfile_parser_test.cc"
                       ,0x10b,"\"foo\" == parser_.outs_[0].AsString()");
    if (local_70 != &local_60) {
      operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
    }
    if (!bVar5) {
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
      goto LAB_0015d305;
    }
    bVar5 = testing::Test::Check
                      (g_current_test,
                       (long)(this->super_DepfileParserTest).parser_.ins_.
                             super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)(this->super_DepfileParserTest).parser_.ins_.
                             super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                             super__Vector_impl_data._M_start == 0x30,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/depfile_parser_test.cc"
                       ,0x10c,"3u == parser_.ins_.size()");
    pTVar4 = g_current_test;
    if (bVar5) {
      pSVar1 = (this->super_DepfileParserTest).parser_.ins_.
               super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar2 = pSVar1->len_;
      local_70 = &local_60;
      if (sVar2 == 0) {
        local_68 = 0;
        local_60 = 0;
      }
      else {
        pcVar3 = pSVar1->str_;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,pcVar3,pcVar3 + sVar2);
      }
      iVar6 = std::__cxx11::string::compare((char *)&local_70);
      testing::Test::Check
                (pTVar4,iVar6 == 0,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/depfile_parser_test.cc"
                 ,0x10d,"\"x\" == parser_.ins_[0].AsString()");
      if (local_70 != &local_60) {
        operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
      }
      pTVar4 = g_current_test;
      pSVar1 = (this->super_DepfileParserTest).parser_.ins_.
               super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar2 = pSVar1[1].len_;
      if (sVar2 == 0) {
        local_68 = 0;
        local_60 = 0;
        local_70 = &local_60;
      }
      else {
        pcVar3 = pSVar1[1].str_;
        local_70 = &local_60;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,pcVar3,pcVar3 + sVar2);
      }
      iVar6 = std::__cxx11::string::compare((char *)&local_70);
      testing::Test::Check
                (pTVar4,iVar6 == 0,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/depfile_parser_test.cc"
                 ,0x10e,"\"y\" == parser_.ins_[1].AsString()");
      if (local_70 != &local_60) {
        operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
      }
      pTVar4 = g_current_test;
      pSVar1 = (this->super_DepfileParserTest).parser_.ins_.
               super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar2 = pSVar1[2].len_;
      if (sVar2 == 0) {
        local_68 = 0;
        local_60 = 0;
        local_70 = &local_60;
      }
      else {
        pcVar3 = pSVar1[2].str_;
        local_70 = &local_60;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,pcVar3,pcVar3 + sVar2);
      }
      iVar6 = std::__cxx11::string::compare((char *)&local_70);
      testing::Test::Check
                (pTVar4,iVar6 == 0,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/depfile_parser_test.cc"
                 ,0x10f,"\"z\" == parser_.ins_[2].AsString()");
      if (local_70 != &local_60) {
        operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
      }
      goto LAB_0015d305;
    }
  }
  g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
LAB_0015d305:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

TEST_F(DepfileParserTest, UnifyMultipleRulesCRLF) {
  string err;
  EXPECT_TRUE(Parse("foo: x\r\n"
                    "foo: y\r\n"
                    "foo \\\r\n"
                    "foo: z\r\n", &err));
  ASSERT_EQ(1u, parser_.outs_.size());
  ASSERT_EQ("foo", parser_.outs_[0].AsString());
  ASSERT_EQ(3u, parser_.ins_.size());
  EXPECT_EQ("x", parser_.ins_[0].AsString());
  EXPECT_EQ("y", parser_.ins_[1].AsString());
  EXPECT_EQ("z", parser_.ins_[2].AsString());
}